

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O0

void __thiscall ParseInt32_SignedAndUnsigned_Test::TestBody(ParseInt32_SignedAndUnsigned_Test *this)

{
  ParseInt32_SignedAndUnsigned_Test *this_local;
  
  anon_unknown.dwarf_62210::AssertInt32Equals(0x80000000,"-2147483648",SignedAndUnsigned);
  anon_unknown.dwarf_62210::AssertInt32Equals(0x80000000,"-0x80000000",SignedAndUnsigned);
  anon_unknown.dwarf_62210::AssertInt32Equals(0xffffffff,"-1",SignedAndUnsigned);
  anon_unknown.dwarf_62210::AssertInt32Equals(0xffffffff,"-0x1",SignedAndUnsigned);
  anon_unknown.dwarf_62210::AssertInt32Equals(1,"+1",SignedAndUnsigned);
  anon_unknown.dwarf_62210::AssertInt32Equals(0xffff5433,"-0xABCD",SignedAndUnsigned);
  anon_unknown.dwarf_62210::AssertInt32Equals(0xabcd,"+0xabcd",SignedAndUnsigned);
  return;
}

Assistant:

TEST(ParseInt32, SignedAndUnsigned) {
  AssertInt32Equals(2147483648, "-2147483648", SignedAndUnsigned);
  AssertInt32Equals(-0x80000000u, "-0x80000000", SignedAndUnsigned);
  AssertInt32Equals(4294967295u, "-1", SignedAndUnsigned);
  AssertInt32Equals(-1, "-0x1", SignedAndUnsigned);
  AssertInt32Equals(1, "+1", SignedAndUnsigned);
  AssertInt32Equals(-0xabcd, "-0xABCD", SignedAndUnsigned);
  AssertInt32Equals(0xabcd, "+0xabcd", SignedAndUnsigned);
}